

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity
          (Vector<kj::ArrayPtr<const_capnp::word>_> *this,size_t newSize)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  ArrayPtr<const_capnp::word> *__dest;
  size_t __n;
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> local_38;
  
  pAVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pAVar1 >> 4)) {
    (this->builder).pos = pAVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ArrayPtr<capnp::word_const>>(newSize)
  ;
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pAVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pAVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)((long)__dest + __n);
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::operator=(&this->builder,&local_38);
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }